

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_object_update(json_t *object,json_t *other)

{
  int iVar1;
  void *pvVar2;
  char *key;
  json_t *value;
  json_object_t *object_1;
  int iVar3;
  
  if ((((object == (json_t *)0x0) || (other == (json_t *)0x0)) || (object->type != JSON_OBJECT)) ||
     (other->type != JSON_OBJECT)) {
LAB_00109d55:
    iVar3 = -1;
  }
  else {
    pvVar2 = hashtable_iter((hashtable_t *)(other + 1));
    iVar3 = 0;
    if (pvVar2 == (void *)0x0) {
      key = (char *)0x0;
    }
    else {
      key = (char *)hashtable_iter_key(pvVar2);
    }
    if (key != (char *)0x0) {
      iVar3 = 0;
      do {
        value = (json_t *)hashtable_iter_value(key + -0x20);
        if (value == (json_t *)0x0) {
          return 0;
        }
        if (value->refcount != 0xffffffffffffffff) {
          value->refcount = value->refcount + 1;
        }
        iVar1 = json_object_set_new_nocheck(object,key,value);
        if (iVar1 != 0) goto LAB_00109d55;
        if (other->type == JSON_OBJECT) {
          pvVar2 = hashtable_iter_next((hashtable_t *)(other + 1),key + -0x20);
        }
        else {
          pvVar2 = (void *)0x0;
        }
        if (pvVar2 == (void *)0x0) {
          key = (char *)0x0;
        }
        else {
          key = (char *)hashtable_iter_key(pvVar2);
        }
      } while (key != (char *)0x0);
    }
  }
  return iVar3;
}

Assistant:

int json_object_update(json_t *object, json_t *other)
{
	const char *key;
	json_t *value;

	if (!json_is_object(object) || !json_is_object(other))
		return -1;

	json_object_foreach(other, key, value) {
		if (json_object_set_nocheck(object, key, value))
			return -1;
	}

	return 0;
}